

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O3

void __thiscall
duckdb::Binder::BindModifiers
          (Binder *this,BoundQueryNode *result,idx_t table_index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *sql_types,SelectBindState *bind_state)

{
  ResultModifierType RVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  ClientContext *pCVar4;
  pointer pBVar5;
  byte bVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *names_00;
  idx_t table_index_00;
  SelectBindState *bind_state_00;
  _Alloc_hider _Var7;
  vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *this_00;
  byte bVar8;
  pointer pBVar9;
  BoundDistinctModifier *pBVar10;
  pointer pEVar11;
  BoundOrderModifier *pBVar12;
  reference pvVar13;
  const_reference other;
  BoundColumnRefExpression *this_01;
  pointer pBVar14;
  BoundLimitModifier *pBVar15;
  InternalException *this_02;
  pointer puVar16;
  pointer pBVar17;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  pointer this_03;
  ulong __n;
  bool bVar18;
  ColumnBinding binding;
  OrderByNullType null_order;
  OrderType order_type;
  OrderByNullType local_aa;
  OrderType local_a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_a8;
  idx_t local_a0;
  _Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false> local_98;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  SelectBindState *local_80;
  string local_78;
  BoundOrderModifier *local_58;
  vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *local_50;
  unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
  *local_48;
  Binder *local_40;
  pointer local_38;
  
  this_03 = (result->modifiers).
            super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (result->modifiers).
             super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = names;
  local_a0 = table_index;
  local_80 = bind_state;
  local_40 = this;
  if (this_03 != local_38) {
    do {
      pBVar9 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
               ::operator->(this_03);
      RVar1 = pBVar9->type;
      local_48 = this_03;
      if (RVar1 == LIMIT_MODIFIER) {
        pBVar9 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                 ::operator->(this_03);
        pBVar15 = BoundResultModifier::Cast<duckdb::BoundLimitModifier>(pBVar9);
        bind_state_00 = local_80;
        table_index_00 = local_a0;
        names_00 = local_a8;
        AssignReturnType(&(pBVar15->limit_val).expression,local_a0,local_a8,sql_types,local_80);
        AssignReturnType(&(pBVar15->offset_val).expression,table_index_00,names_00,sql_types,
                         bind_state_00);
      }
      else if (RVar1 == ORDER_MODIFIER) {
        pBVar9 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                 ::operator->(this_03);
        pBVar12 = BoundResultModifier::Cast<duckdb::BoundOrderModifier>(pBVar9);
        pBVar17 = (pBVar12->orders).
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar5 = (pBVar12->orders).
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pBVar17 != pBVar5) {
          local_50 = (vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                     &pBVar12->orders;
          bVar8 = 0;
          local_58 = pBVar12;
          do {
            bVar6 = bVar8;
            local_90._M_head_impl =
                 (pBVar17->expression).
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pBVar17->expression).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            FinalizeBindOrderExpression
                      ((duckdb *)&local_78,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_90,local_a0,local_a8,sql_types,local_80);
            _Var7._M_p = local_78._M_dataplus._M_p;
            local_78._M_dataplus._M_p = (pointer)0x0;
            _Var3._M_head_impl =
                 (pBVar17->expression).
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pBVar17->expression).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (Expression *)_Var7._M_p;
            if ((_Var3._M_head_impl != (Expression *)0x0) &&
               ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))(),
               (long *)local_78._M_dataplus._M_p != (long *)0x0)) {
              (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
            }
            local_78._M_dataplus._M_p = (pointer)0x0;
            if (local_90._M_head_impl != (Expression *)0x0) {
              (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            this_00 = local_50;
            local_90._M_head_impl = (Expression *)0x0;
            bVar18 = (pBVar17->expression).
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                     _M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
                     (Expression *)0x0;
            pBVar17 = pBVar17 + 1;
            bVar8 = bVar6 | bVar18;
          } while (pBVar17 != pBVar5);
          pBVar12 = local_58;
          if ((bool)(bVar6 | bVar18)) {
            pvVar13 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                                ((vector<duckdb::BoundOrderByNode,_true> *)local_50,0);
            local_a9 = pvVar13->type;
            pvVar13 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                                ((vector<duckdb::BoundOrderByNode,_true> *)this_00,0);
            local_aa = pvVar13->null_order;
            ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
            _M_erase_at_end((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             *)this_00,*(pointer *)this_00);
            pBVar12 = local_58;
            if ((sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              __n = 0;
              do {
                other = vector<duckdb::LogicalType,_true>::operator[](sql_types,__n);
                this_01 = (BoundColumnRefExpression *)operator_new(0x70);
                LogicalType::LogicalType((LogicalType *)&local_78,other);
                binding.column_index = __n;
                binding.table_index = local_a0;
                BoundColumnRefExpression::BoundColumnRefExpression
                          (this_01,(LogicalType *)&local_78,binding,0);
                local_98._M_head_impl = this_01;
                LogicalType::~LogicalType((LogicalType *)&local_78);
                if (__n < (ulong)((long)(local_a8->
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_a8->
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                  pBVar14 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                            ::operator->((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                                          *)&local_98);
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](local_a8,__n);
                  ::std::__cxx11::string::_M_assign
                            ((string *)&(pBVar14->super_Expression).super_BaseExpression.alias);
                }
                ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
                emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                          (local_50,&local_a9,&local_aa,
                           (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                            *)&local_98);
                if (local_98._M_head_impl != (BoundColumnRefExpression *)0x0) {
                  (*((local_98._M_head_impl)->super_Expression).super_BaseExpression.
                    _vptr_BaseExpression[1])();
                }
                __n = __n + 1;
                pBVar12 = local_58;
              } while (__n < (ulong)(((long)(sql_types->
                                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ).
                                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(sql_types->
                                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ).
                                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                    -0x5555555555555555));
            }
          }
        }
        pBVar5 = (pBVar12->orders).
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pBVar17 = (pBVar12->orders).
                       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       .
                       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_start; pBVar17 != pBVar5;
            pBVar17 = pBVar17 + 1) {
          pCVar4 = local_40->context;
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(&pBVar17->expression);
          ExpressionBinder::PushCollation
                    (pCVar4,&pBVar17->expression,&pEVar11->return_type,ALL_COLLATIONS);
        }
      }
      else if (RVar1 == DISTINCT_MODIFIER) {
        pBVar9 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                 ::operator->(this_03);
        pBVar10 = BoundResultModifier::Cast<duckdb::BoundDistinctModifier>(pBVar9);
        puVar16 = (pBVar10->target_distincts).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (pBVar10->target_distincts).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar16 != puVar2) {
          do {
            local_88._M_head_impl =
                 (puVar16->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (puVar16->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            FinalizeBindOrderExpression
                      ((duckdb *)&local_78,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_88,local_a0,local_a8,sql_types,local_80);
            _Var7._M_p = local_78._M_dataplus._M_p;
            local_78._M_dataplus._M_p = (pointer)0x0;
            _Var3._M_head_impl =
                 (puVar16->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (puVar16->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (Expression *)_Var7._M_p;
            if (_Var3._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
            }
            if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
            }
            local_78._M_dataplus._M_p = (pointer)0x0;
            if (local_88._M_head_impl != (Expression *)0x0) {
              (*((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_88._M_head_impl = (Expression *)0x0;
            if ((puVar16->
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
                .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
                (Expression *)0x0) {
              this_02 = (InternalException *)__cxa_allocate_exception(0x10);
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"DISTINCT ON ORDER BY ALL not supported","");
              InternalException::InternalException(this_02,&local_78);
              __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            puVar16 = puVar16 + 1;
          } while (puVar16 != puVar2);
          puVar2 = (pBVar10->target_distincts).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar16 = (pBVar10->target_distincts).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar2;
              puVar16 = puVar16 + 1) {
            pCVar4 = local_40->context;
            pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(puVar16);
            ExpressionBinder::PushCollation(pCVar4,puVar16,&pEVar11->return_type,ALL_COLLATIONS);
          }
        }
      }
      this_03 = local_48 + 1;
    } while (this_03 != local_38);
  }
  return;
}

Assistant:

void Binder::BindModifiers(BoundQueryNode &result, idx_t table_index, const vector<string> &names,
                           const vector<LogicalType> &sql_types, const SelectBindState &bind_state) {
	for (auto &bound_mod : result.modifiers) {
		switch (bound_mod->type) {
		case ResultModifierType::DISTINCT_MODIFIER: {
			auto &distinct = bound_mod->Cast<BoundDistinctModifier>();
			// set types of distinct targets
			for (auto &expr : distinct.target_distincts) {
				expr = FinalizeBindOrderExpression(std::move(expr), table_index, names, sql_types, bind_state);
				if (!expr) {
					throw InternalException("DISTINCT ON ORDER BY ALL not supported");
				}
			}
			for (auto &expr : distinct.target_distincts) {
				ExpressionBinder::PushCollation(context, expr, expr->return_type);
			}
			break;
		}
		case ResultModifierType::LIMIT_MODIFIER: {
			auto &limit = bound_mod->Cast<BoundLimitModifier>();
			AssignReturnType(limit.limit_val.GetExpression(), table_index, names, sql_types, bind_state);
			AssignReturnType(limit.offset_val.GetExpression(), table_index, names, sql_types, bind_state);
			break;
		}
		case ResultModifierType::ORDER_MODIFIER: {
			auto &order = bound_mod->Cast<BoundOrderModifier>();
			bool order_by_all = false;
			for (auto &order_node : order.orders) {
				auto &expr = order_node.expression;
				expr = FinalizeBindOrderExpression(std::move(expr), table_index, names, sql_types, bind_state);
				if (!expr) {
					order_by_all = true;
				}
			}
			if (order_by_all) {
				D_ASSERT(order.orders.size() == 1);
				auto order_type = order.orders[0].type;
				auto null_order = order.orders[0].null_order;
				order.orders.clear();
				for (idx_t i = 0; i < sql_types.size(); i++) {
					auto expr = make_uniq<BoundColumnRefExpression>(sql_types[i], ColumnBinding(table_index, i));
					if (i < names.size()) {
						expr->SetAlias(names[i]);
					}
					order.orders.emplace_back(order_type, null_order, std::move(expr));
				}
			}
			for (auto &order_node : order.orders) {
				auto &expr = order_node.expression;
				ExpressionBinder::PushCollation(context, order_node.expression, expr->return_type);
			}
			break;
		}
		default:
			break;
		}
	}
}